

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fe241b::AverageTest_8x8_quad<unsigned_char>::TestConstantValue
          (AverageTest_8x8_quad<unsigned_char> *this,uchar value)

{
  uchar in_SIL;
  AverageTestBase<unsigned_char> *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  AverageTestBase<unsigned_char>::FillConstant(in_RDI,in_SIL);
  CheckAverages((AverageTest_8x8_quad<unsigned_char> *)CONCAT17(in_SIL,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void TestConstantValue(Pixel value) {
    FillConstant(value);
    CheckAverages();
  }